

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::RepeatedFieldHelper<10>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  RepeatedPtrFieldBase *array;
  long lVar7;
  
  if (0 < *(int *)((long)field + 8)) {
    lVar7 = 0;
    do {
      uVar6 = md->tag;
      pbVar2 = output->ptr;
      if (uVar6 < 0x80) {
        *pbVar2 = (byte)uVar6;
        pbVar2 = pbVar2 + 1;
      }
      else {
        *pbVar2 = (byte)uVar6 | 0x80;
        if (uVar6 < 0x4000) {
          pbVar2[1] = (byte)(uVar6 >> 7);
          pbVar2 = pbVar2 + 2;
        }
        else {
          pbVar2 = pbVar2 + 2;
          uVar6 = uVar6 >> 7;
          do {
            pbVar3 = pbVar2;
            pbVar3[-1] = (byte)uVar6 | 0x80;
            uVar4 = uVar6 >> 7;
            pbVar2 = pbVar3 + 1;
            bVar1 = 0x3fff < uVar6;
            uVar6 = uVar4;
          } while (bVar1);
          *pbVar3 = (byte)uVar4;
        }
      }
      output->ptr = pbVar2;
      lVar5 = *(long *)((long)field + 0x10) + 8;
      if (*(long *)((long)field + 0x10) == 0) {
        lVar5 = 0;
      }
      SerializeGroupTo<google::protobuf::internal::ArrayOutput>
                (*(MessageLite **)(lVar5 + lVar7 * 8),md->ptr,output);
      uVar6 = md->tag + 1;
      pbVar2 = output->ptr;
      if (uVar6 < 0x80) {
        *pbVar2 = (byte)uVar6;
        pbVar2 = pbVar2 + 1;
      }
      else {
        *pbVar2 = (byte)uVar6 | 0x80;
        if (uVar6 < 0x4000) {
          pbVar2[1] = (byte)(uVar6 >> 7);
          pbVar2 = pbVar2 + 2;
        }
        else {
          pbVar2 = pbVar2 + 2;
          uVar6 = uVar6 >> 7;
          do {
            pbVar3 = pbVar2;
            pbVar3[-1] = (byte)uVar6 | 0x80;
            uVar4 = uVar6 >> 7;
            pbVar2 = pbVar3 + 1;
            bVar1 = 0x3fff < uVar6;
            uVar6 = uVar4;
          } while (bVar1);
          *pbVar3 = (byte)uVar4;
        }
      }
      output->ptr = pbVar2;
      lVar7 = lVar7 + 1;
    } while (lVar7 < *(int *)((long)field + 8));
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    const internal::RepeatedPtrFieldBase& array =
        Get<internal::RepeatedPtrFieldBase>(field);
    for (int i = 0; i < AccessorHelper::Size(array); i++) {
      WriteTagTo(md.tag, output);
      SerializeGroupTo(
          static_cast<const MessageLite*>(AccessorHelper::Get(array, i)),
          static_cast<const SerializationTable*>(md.ptr), output);
      WriteTagTo(md.tag + 1, output);
    }
  }